

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-arch.cpp
# Opt level: O0

string * __thiscall LLM_TN_IMPL::str_abi_cxx11_(LLM_TN_IMPL *this)

{
  bool bVar1;
  const_iterator __s;
  const_iterator __a;
  mapped_type *ppcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *name;
  map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
  *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
  *in_stack_ffffffffffffffd0;
  allocator<char> local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = in_RSI;
  std::
  map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
  ::at((map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
        *)in_stack_ffffffffffffffd0,
       (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  __s = std::
        map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
        ::find(in_stack_ffffffffffffffa8,(key_type *)0x3bc772);
  std::
  map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
  ::at((map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
        *)in_stack_ffffffffffffffd0,
       (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  __a = std::
        map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
        ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffe0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__s._M_node,(allocator<char> *)__a._M_node);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    uVar3 = in_stack_ffffffffffffffc8 & 0xffffff;
    std::
    map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
    ::at((map<llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>,_std::less<llm_arch>,_std::allocator<std::pair<const_llm_arch,_std::map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>_>_>_>
          *)in_stack_ffffffffffffffd0,
         (key_type *)
         (CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) & 0xffffffff00ffffff));
    ppcVar2 = std::
              map<llm_tensor,_const_char_*,_std::less<llm_tensor>,_std::allocator<std::pair<const_llm_tensor,_const_char_*>_>_>
              ::at(in_stack_ffffffffffffffd0,(key_type *)CONCAT44(in_stack_ffffffffffffffcc,uVar3));
    format_abi_cxx11_((char *)in_RDI,*ppcVar2,(ulong)*(uint *)&in_RSI->field_2,
                      (ulong)*(uint *)((long)&in_RSI->field_2 + 4));
    if (in_RSI->_M_string_length != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,".");
      std::__cxx11::string::operator+=((string *)in_RDI,(char *)in_RSI->_M_string_length);
    }
  }
  return in_RDI;
}

Assistant:

std::string LLM_TN_IMPL::str() const {
    if (LLM_TENSOR_NAMES.at(arch).find(tensor) == LLM_TENSOR_NAMES.at(arch).end()) {
        return "__missing__";
    }

    std::string name = ::format(LLM_TENSOR_NAMES.at(arch).at(tensor), bid, xid);

    if (suffix != nullptr) {
        name += ".";
        name += suffix;
    }

    return name;
}